

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O0

bool asmjit::_abi_1_10::a64::armCheckMemBaseIndexRel(Mem *mem)

{
  RegType a;
  RegType RVar1;
  bool bVar2;
  RegType indexType;
  RegType baseType;
  uint32_t kIndexMask;
  uint32_t kBaseMask;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 local_1;
  
  a = BaseMem::baseType((BaseMem *)0x1636a3);
  RVar1 = BaseMem::indexType((BaseMem *)0x1636b1);
  bVar2 = Support::bitTest<unsigned_int,asmjit::_abi_1_10::RegType>
                    (CONCAT13(a,CONCAT12(RVar1,in_stack_ffffffffffffffe4)),
                     (RegType)((uint)in_stack_ffffffffffffffe0 >> 0x18));
  if (bVar2) {
    bVar2 = operator>(a,kLabelTag);
    if (bVar2) {
      bVar2 = Support::bitTest<unsigned_int,asmjit::_abi_1_10::RegType>
                        (CONCAT13(a,CONCAT12(RVar1,in_stack_ffffffffffffffe4)),
                         (RegType)((uint)in_stack_ffffffffffffffe0 >> 0x18));
      if (bVar2) {
        if (RVar1 == kNone) {
          local_1 = true;
        }
        else {
          bVar2 = BaseMem::hasOffset((BaseMem *)
                                     CONCAT17(a,CONCAT16(RVar1,CONCAT24(in_stack_ffffffffffffffe4,
                                                                        in_stack_ffffffffffffffe0)))
                                    );
          local_1 = (bool)((bVar2 ^ 0xffU) & 1);
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = RVar1 == kNone;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool armCheckMemBaseIndexRel(const Mem& mem) noexcept {
  // Allowed base types (Nothing, Label, and GpX).
  constexpr uint32_t kBaseMask  = B(0) |
                                  B(RegType::kLabelTag) |
                                  B(RegType::kARM_GpX);

  // Allowed index types (Nothing, GpW, and GpX).
  constexpr uint32_t kIndexMask = B(0) |
                                  B(RegType::kARM_GpW) |
                                  B(RegType::kARM_GpX) ;

  RegType baseType = mem.baseType();
  RegType indexType = mem.indexType();

  if (!Support::bitTest(kBaseMask, baseType))
    return false;

  if (baseType > RegType::kLabelTag) {
    // Index allows either GpW or GpX.
    if (!Support::bitTest(kIndexMask, indexType))
      return false;

    if (indexType == RegType::kNone)
      return true;
    else
      return !mem.hasOffset();
  }
  else {
    // No index register allowed if this is a PC relative address (literal).
    return indexType == RegType::kNone;
  }
}